

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParseBase.c
# Opt level: O1

void uriWriteQuadToDoubleByte(uchar *hexDigits,int digitCount,uchar *output)

{
  uchar uVar1;
  
  switch(digitCount) {
  case 1:
    *output = '\0';
    uVar1 = *hexDigits;
    break;
  case 2:
    *output = '\0';
    uVar1 = *hexDigits * '\x10' + hexDigits[1];
    break;
  case 3:
    *output = *hexDigits;
    uVar1 = hexDigits[1] * '\x10' + hexDigits[2];
    break;
  case 4:
    *output = *hexDigits * '\x10' + hexDigits[1];
    uVar1 = hexDigits[2] * '\x10' + hexDigits[3];
    break;
  default:
    goto switchD_001b9859_default;
  }
  output[1] = uVar1;
switchD_001b9859_default:
  return;
}

Assistant:

void uriWriteQuadToDoubleByte(const unsigned char * hexDigits, int digitCount, unsigned char * output) {
	switch (digitCount) {
	case 1:
		/* 0x___? -> \x00 \x0? */
		output[0] = 0;
		output[1] = hexDigits[0];
		break;

	case 2:
		/* 0x__?? -> \0xx \x?? */
		output[0] = 0;
		output[1] = 16 * hexDigits[0] + hexDigits[1];
		break;

	case 3:
		/* 0x_??? -> \0x? \x?? */
		output[0] = hexDigits[0];
		output[1] = 16 * hexDigits[1] + hexDigits[2];
		break;

	case 4:
		/* 0x???? -> \0?? \x?? */
		output[0] = 16 * hexDigits[0] + hexDigits[1];
		output[1] = 16 * hexDigits[2] + hexDigits[3];
		break;

	}
}